

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

void __thiscall
axl::sl::
OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
::clear(OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
        *this)

{
  BoxListEntry<axl::rc::Ptr<void>_> *pBVar1;
  BoxListEntry<axl::rc::Ptr<void>_> *p;
  Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_> local_19;
  
  p = (this->
      super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
      ).super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_head;
  if (p != (BoxListEntry<axl::rc::Ptr<void>_> *)0x0) {
    while (p != (BoxListEntry<axl::rc::Ptr<void>_> *)0x0) {
      pBVar1 = (BoxListEntry<axl::rc::Ptr<void>_> *)(p->super_ListLink).m_next;
      mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>::operator()(&local_19,p);
      p = pBVar1;
    }
    (this->
    super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
    ).super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_head =
         (BoxListEntry<axl::rc::Ptr<void>_> *)0x0;
    (this->
    super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
    ).super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_tail =
         (BoxListEntry<axl::rc::Ptr<void>_> *)0x0;
    (this->
    super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
    ).super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_count = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}